

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Osc::render(V2Osc *this,float *dest,int nsamples)

{
  float fVar1;
  bool bVar2;
  V2Instance *pVVar3;
  ulong uVar4;
  float fVar5;
  
  switch(this->mode & 7) {
  case 1:
    renderTriSaw(this,dest,nsamples);
    return;
  case 2:
    renderPulse(this,dest,nsamples);
    return;
  case 3:
    renderSin(this,dest,nsamples);
    return;
  case 4:
    renderNoise(this,dest,nsamples);
    return;
  case 5:
    renderFMSin(this,dest,nsamples);
    return;
  case 6:
    if (0 < nsamples) {
      fVar1 = this->gain;
      pVVar3 = this->inst;
      bVar2 = this->ring;
      uVar4 = 0;
      do {
        fVar5 = (pVVar3->auxabuf[uVar4].field_0.l +
                *(float *)((long)pVVar3->auxabuf + uVar4 * 8 + 4)) * fVar1 * 0.6;
        if (bVar2 != false) {
          fVar5 = fVar5 * dest[uVar4];
        }
        dest[uVar4] = fVar5;
        uVar4 = uVar4 + 1;
      } while ((uint)nsamples != uVar4);
    }
    break;
  case 7:
    if (0 < nsamples) {
      fVar1 = this->gain;
      pVVar3 = this->inst;
      bVar2 = this->ring;
      uVar4 = 0;
      do {
        fVar5 = (pVVar3->auxbbuf[uVar4].field_0.l +
                *(float *)((long)pVVar3->auxbbuf + uVar4 * 8 + 4)) * fVar1 * 0.6;
        if (bVar2 != false) {
          fVar5 = fVar5 * dest[uVar4];
        }
        dest[uVar4] = fVar5;
        uVar4 = uVar4 + 1;
      } while ((uint)nsamples != uVar4);
    }
  }
  return;
}

Assistant:

void render(float *dest, int nsamples)
    {
        switch (mode & 7)
        {
        case OSC_OFF:     break;
        case OSC_TRI_SAW: renderTriSaw(dest, nsamples); break;
        case OSC_PULSE:   renderPulse(dest, nsamples); break;
        case OSC_SIN:     renderSin(dest, nsamples); break;
        case OSC_NOISE:   renderNoise(dest, nsamples); break;
        case OSC_FM_SIN:  renderFMSin(dest, nsamples); break;
        case OSC_AUXA:    renderAux(dest, inst->auxabuf, nsamples); break;
        case OSC_AUXB:    renderAux(dest, inst->auxbbuf, nsamples); break;
        }

        DEBUG_PLOT(this, dest, nsamples);
    }